

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::
       MessageSize<CoreML::Specification::AsinhLayerParams>(AsinhLayerParams *value)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  uVar1 = (value->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (value->_cached_size_).size_.super___atomic_base<int>._M_i = (uint)lVar4;
  uVar3 = (uint)lVar4 | 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  return (ulong)(iVar2 * 9 + 0x49U >> 6) + lVar4;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }